

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

bool __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
contains<char_const*&>
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
           *this,char **item)

{
  enable_if_t<detail::move_if_unreferenced<bool>::value,_bool> eVar1;
  str_attr_accessor local_40;
  object local_20;
  
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::attr
            (&local_40,
             (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
              *)this,"__contains__");
  operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              *)&local_20,(char **)&local_40);
  eVar1 = cast<bool>(&local_20);
  object::~object(&local_20);
  object::~object(&local_40.cache);
  return eVar1;
}

Assistant:

bool object_api<D>::contains(T &&item) const {
    return attr("__contains__")(std::forward<T>(item)).template cast<bool>();
}